

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void __kmp_api_omp_get_partition_place_nums_(int *place_nums)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if (__kmp_affin_mask_size != 0) {
    iVar4 = __kmp_get_global_thread_id_reg();
    auVar3 = _DAT_0017dda0;
    uVar1 = (__kmp_threads[iVar4]->th).th_first_place;
    uVar2 = (__kmp_threads[iVar4]->th).th_last_place;
    if (-1 < (int)(uVar1 | uVar2)) {
      uVar5 = uVar2;
      if ((int)uVar1 < (int)uVar2) {
        uVar5 = uVar1;
      }
      lVar6 = (long)(int)uVar1 - (long)(int)uVar2;
      lVar8 = -lVar6;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      uVar7 = (ulong)((int)lVar8 + 1);
      lVar8 = uVar7 - 1;
      auVar9._8_4_ = (int)lVar8;
      auVar9._0_8_ = lVar8;
      auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 3;
      auVar9 = auVar9 ^ _DAT_0017dda0;
      auVar10 = _DAT_0017e420;
      auVar11 = _DAT_00179000;
      do {
        auVar12 = auVar11 ^ auVar3;
        iVar4 = auVar9._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar4 && auVar9._0_4_ < auVar12._0_4_ || iVar4 < auVar12._4_4_
                    ) & 1)) {
          place_nums[lVar8 + -3] = uVar5;
        }
        if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
            auVar12._12_4_ <= auVar9._12_4_) {
          place_nums[lVar8 + -2] = uVar5 + 1;
        }
        auVar12 = auVar10 ^ auVar3;
        iVar13 = auVar12._4_4_;
        if (iVar13 <= iVar4 && (iVar13 != iVar4 || auVar12._0_4_ <= auVar9._0_4_)) {
          place_nums[lVar8 + -1] = uVar5 + 2;
          place_nums[lVar8] = uVar5 + 3;
        }
        lVar6 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 4;
        auVar11._8_8_ = lVar6 + 4;
        lVar6 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 4;
        auVar10._8_8_ = lVar6 + 4;
        lVar6 = lVar8 - (uVar7 + 3 & 0xfffffffffffffffc);
        lVar8 = lVar8 + 4;
        uVar5 = uVar5 + 4;
      } while (lVar6 != -1);
    }
  }
  return;
}

Assistant:

void
    FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_PARTITION_PLACE_NUMS)(int *place_nums) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
// Nothing.
#else
  int i, gtid, place_num, first_place, last_place, start, end;
  kmp_info_t *thread;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return;
  if (first_place <= last_place) {
    start = first_place;
    end = last_place;
  } else {
    start = last_place;
    end = first_place;
  }
  for (i = 0, place_num = start; place_num <= end; ++place_num, ++i) {
    place_nums[i] = place_num;
  }
#endif
}